

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  CmdLineParseException *pCVar6;
  pointer pbVar7;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *plVar8;
  int iVar9;
  size_type sVar10;
  _List_node_base *p_Var11;
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->_progName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(args,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  local_70._M_dataplus._M_p = (pointer)((ulong)local_70._M_dataplus._M_p._4_4_ << 0x20);
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    iVar9 = 0;
  }
  else {
    plVar8 = &this->_argList;
    iVar9 = 0;
    p_Var11 = (_List_node_base *)plVar8;
LAB_0012b071:
    do {
      p_Var11 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var11->_M_next)->
                _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var11 == (_List_node_base *)plVar8) {
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar1 = pbVar7[(int)(uint)local_70._M_dataplus._M_p]._M_string_length;
        if (sVar1 != 0) {
          pcVar2 = pbVar7[(int)(uint)local_70._M_dataplus._M_p]._M_dataplus._M_p;
          if (*pcVar2 == '-') {
            if (sVar1 != 1) {
              sVar10 = 1;
              do {
                if (pcVar2[sVar10] != '\a') goto LAB_0012b0e4;
                sVar10 = sVar10 + 1;
              } while (sVar1 != sVar10);
            }
          }
          else {
LAB_0012b0e4:
            if (Arg::ignoreRestRef()::ign == '\0') {
              pCVar6 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Couldn\'t find match for argument","");
              CmdLineParseException::CmdLineParseException
                        (pCVar6,&local_50,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                         (int)(uint)local_70._M_dataplus._M_p);
              __cxa_throw(pCVar6,&CmdLineParseException::typeinfo,ArgException::~ArgException);
            }
          }
        }
      }
      else {
        cVar3 = (**(code **)(*(long *)p_Var11[1]._M_next + 0x18))(p_Var11[1]._M_next,&local_70,args)
        ;
        if (cVar3 == '\0') goto LAB_0012b071;
        iVar4 = XorHandler::check(&this->_xorHandler,(Arg *)p_Var11[1]._M_next);
        iVar9 = iVar9 + iVar4;
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar5 = (uint)local_70._M_dataplus._M_p + 1;
      local_70._M_dataplus._M_p._0_4_ = uVar5;
      p_Var11 = (_List_node_base *)plVar8;
    } while ((ulong)uVar5 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
  }
  iVar4 = this->_numRequired;
  if (iVar9 < iVar4) {
    missingArgsException(this);
    iVar4 = this->_numRequired;
  }
  if (iVar4 < iVar9) {
    pCVar6 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Too many arguments!","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"undefined","");
    CmdLineParseException::CmdLineParseException(pCVar6,&local_50,&local_70);
    __cxa_throw(pCVar6,&CmdLineParseException::typeinfo,ArgException::~ArgException);
  }
  return;
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;

	try {
		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() )
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}